

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

void __thiscall higan::Buffer::Buffer(Buffer *this)

{
  Buffer(this,0x400);
  return;
}

Assistant:

Buffer::Buffer():
		Buffer(DEFAULT_BUFFER_SIZE)
{

}